

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O2

bool __thiscall
FactorisedJoin::seekValue
          (FactorisedJoin *this,DTreeNode *node,int *rel,int *ordering,int numOfRel,int **l,int *u,
          double *val)

{
  Database pTVar1;
  pointer ppVar2;
  int *piVar3;
  pointer ppdVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  
  iVar12 = *rel;
  iVar11 = (iVar12 + -1) % numOfRel;
  pTVar1 = this->_data;
  ppVar2 = this->_ids[node->_id].
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = *l;
  dVar14 = pTVar1[ppVar2[ordering[(iVar11 >> 0x1f & numOfRel) + iVar11]].first].
           super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar3[ppVar2[ordering[(iVar11 >> 0x1f & numOfRel) + iVar11]].first]]
           [ppVar2[ordering[(iVar11 >> 0x1f & numOfRel) + iVar11]].second];
  while( true ) {
    iVar11 = ppVar2[ordering[iVar12]].first;
    iVar12 = ppVar2[ordering[iVar12]].second;
    uVar8 = (ulong)piVar3[iVar11];
    ppdVar4 = pTVar1[iVar11].super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar15 = ppdVar4[uVar8][iVar12];
    if ((dVar15 == dVar14) && (!NAN(dVar15) && !NAN(dVar14))) break;
    uVar10 = (ulong)u[iVar11];
    if (ppdVar4[uVar10][iVar12] <= dVar14 && dVar14 != ppdVar4[uVar10][iVar12]) goto LAB_0012dd4b;
    iVar13 = 1;
    while( true ) {
      iVar9 = (int)uVar10;
      iVar6 = (int)uVar8;
      if ((iVar9 < iVar6) || (dVar14 <= dVar15)) break;
      uVar7 = iVar6 + iVar13;
      uVar8 = (ulong)uVar7;
      if (iVar9 <= (int)uVar7) {
        piVar3[iVar11] = iVar9;
        iVar13 = iVar9 - iVar6;
        goto LAB_0012dc94;
      }
      piVar3[iVar11] = uVar7;
      dVar15 = ppdVar4[(int)uVar7][iVar12];
      iVar13 = iVar13 << (dVar15 < dVar14);
      uVar10 = (ulong)(uint)u[iVar11];
    }
    uVar10 = uVar8 & 0xffffffff;
LAB_0012dc94:
    uVar7 = (uint)uVar10;
    if ((1 < iVar13) && (dVar14 <= ppdVar4[(long)(int)uVar7 + -1][iVar12])) {
      iVar13 = uVar7 - iVar13;
      while( true ) {
        uVar8 = uVar10;
        iVar6 = (int)uVar8;
        uVar5 = (iVar6 + iVar13) / 2;
        uVar7 = uVar5 - 1;
        if ((iVar6 <= iVar13) ||
           ((ppdVar4[(int)uVar7][iVar12] <= dVar14 && dVar14 != ppdVar4[(int)uVar7][iVar12] &&
            (dVar14 <= ppdVar4[(int)uVar5][iVar12])))) break;
        uVar10 = (ulong)uVar7;
        if (ppdVar4[(int)uVar5][iVar12] < dVar14) {
          uVar10 = uVar8 & 0xffffffff;
          iVar13 = uVar5 + 1;
        }
      }
      if (ppdVar4[(int)uVar7][iVar12] < dVar14) {
        uVar7 = uVar5;
      }
      piVar3[iVar11] = uVar7;
    }
    dVar14 = ppdVar4[(int)uVar7][iVar12];
    iVar12 = (*rel + 1) % numOfRel;
    *rel = iVar12;
  }
  *val = dVar15;
LAB_0012dd4b:
  return (bool)(-(dVar15 != dVar14) & 1);
}

Assistant:

bool FactorisedJoin::seekValue(DTreeNode* node, int &rel, int* ordering, int numOfRel,
                               int* &l, int* u, double &val)
{
    int nodeID = node->_id;

    int index = mod(rel - 1, numOfRel);
    int i = _ids[nodeID][ordering[index]].first;
    int j = _ids[nodeID][ordering[index]].second;

    /* this is the value we are seeking. */
    double max = _data[i][l[i]][j];

    double min;
    while (true)
    {
        i = _ids[nodeID][ordering[rel]].first;
        j = _ids[nodeID][ordering[rel]].second;
        min = _data[i][l[i]][j];

        /* If we found the value then we return. */
        if (min == max)
        {
            val = min;
            return false;
        }
        /* else we seek a the least upper bound */
        else
        {
            /* If the value we seek is bigger than the last value in the
             * relation we can return. */
            if (max > _data[i][u[i]][j])
                return true;

            /* We seek the value with increasing leaps. */
            int leap = 1;
            while (l[i] <= u[i] && min < max)
            {
                if (l[i] + leap < u[i])
                {
                    l[i] += leap;
                    min = _data[i][l[i]][j];
                    if (min < max)
                        leap *= 2;
                }
                else
                {
                    leap = u[i] - l[i];
                    l[i] = u[i];
                    min = _data[i][l[i]][j];
                    break;
                }
            }

            /*
             * When we found an upper bound we need to find the least upper bound;
             * we backtrack using binary search.
             */
            if (leap > 1 && max <= _data[i][l[i] - 1][j])
            {
                int high = l[i], low = l[i] - leap, mid = 0;
                while (high > low && high != low)
                {
                    mid = (high + low) / 2;
                    if (max > _data[i][mid - 1][j] && max <= _data[i][mid][j])
                    {
                        l[i] = mid;
                        break;
                    }
                    else if (max <= _data[i][mid][j])
                        high = mid - 1;
                    else
                        low = mid + 1;
                }

                mid = (high + low) / 2;
                if (_data[i][mid - 1][j] >= max)
                    mid -= 1;

                l[i] = mid;
            }

            /*
             * Once the least upper bound is found we set max to that value and
             * continue with the next relation.
             */
            max = _data[i][l[i]][j];
            rel = (rel + 1) % numOfRel;
        }
    }

    return false;
}